

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::Inserter::insertOne
          (Inserter *this,qsizetype pos,QDockAreaLayoutItem *t)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  long lVar2;
  long lVar3;
  
  pQVar1 = this->begin;
  lVar3 = this->size;
  this_00 = pQVar1 + lVar3;
  this->end = this_00;
  this->last = pQVar1 + lVar3 + -1;
  this->where = pQVar1 + pos;
  lVar2 = lVar3 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar2;
  this->sourceCopyAssign = 1;
  if (0 < lVar2) {
    QDockAreaLayoutItem::QDockAreaLayoutItem(this_00,pQVar1 + lVar3 + -1);
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        QDockAreaLayoutItem::operator=
                  ((QDockAreaLayoutItem *)((long)&this->last->widgetItem + lVar2),
                   (QDockAreaLayoutItem *)((long)&this->last[-1].widgetItem + lVar2));
        lVar3 = lVar3 + -1;
        lVar2 = lVar2 + -0x28;
      } while (lVar3 != this->move);
    }
    QDockAreaLayoutItem::operator=(this->where,t);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar2;
  this->move = 0;
  this->sourceCopyAssign = lVar2;
  QDockAreaLayoutItem::QDockAreaLayoutItem(this_00,t);
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }